

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

void __thiscall ON_OBSOLETE_V5_DimRadial::ON_OBSOLETE_V5_DimRadial(ON_OBSOLETE_V5_DimRadial *this)

{
  int iVar1;
  ON_2dPoint *__s;
  ON_AnnotationTextFormula *pOVar2;
  
  ON_OBSOLETE_V5_Annotation::ON_OBSOLETE_V5_Annotation(&this->super_ON_OBSOLETE_V5_Annotation);
  (this->super_ON_OBSOLETE_V5_Annotation).super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_0081fc58;
  (this->super_ON_OBSOLETE_V5_Annotation).m_type = dtDimDiameter;
  (this->super_ON_OBSOLETE_V5_Annotation).m_textdisplaymode = kInLine;
  ON_wString::operator=
            (&(this->super_ON_OBSOLETE_V5_Annotation).m_usertext.super_ON_wString,
             DefaultDiameterText::defstr);
  (this->super_ON_OBSOLETE_V5_Annotation).m_usertext.m_rect.left = 0;
  (this->super_ON_OBSOLETE_V5_Annotation).m_usertext.m_rect.top = 0;
  (this->super_ON_OBSOLETE_V5_Annotation).m_usertext.m_rect.right = 0;
  (this->super_ON_OBSOLETE_V5_Annotation).m_usertext.m_rect.bottom = 0;
  pOVar2 = ON_AnnotationTextFormula::Get(&this->super_ON_OBSOLETE_V5_Annotation);
  if (pOVar2 != (ON_AnnotationTextFormula *)0x0) {
    (*(pOVar2->super_ON_UserData).super_ON_Object._vptr_ON_Object[4])(pOVar2);
  }
  if ((uint)(this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.
            m_capacity < 4) {
    ON_SimpleArray<ON_2dPoint>::SetCapacity
              (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>,4)
    ;
  }
  iVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.
          m_capacity;
  if (3 < (long)iVar1) {
    (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count = 4;
  }
  __s = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a;
  if (0 < iVar1 && __s != (ON_2dPoint *)0x0) {
    memset(__s,0,(long)iVar1 << 4);
    return;
  }
  return;
}

Assistant:

ON_OBSOLETE_V5_DimRadial::ON_OBSOLETE_V5_DimRadial()
{
  m_type = ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter;
  m_textdisplaymode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kInLine;
  SetTextValue(DefaultDiameterText());
  SetTextFormula(0);
  m_points.Reserve(ON_OBSOLETE_V5_DimRadial::dim_pt_count);
  m_points.SetCount(ON_OBSOLETE_V5_DimRadial::dim_pt_count);
  m_points.Zero();
}